

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::Array<const_char>::~Array(Array<const_char> *this)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = this->ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = this->size_;
    this->ptr = (char *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }